

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_Line * __thiscall
ON_MeshTopology::TopEdgeLine(ON_Line *__return_storage_ptr__,ON_MeshTopology *this,int tope_index)

{
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  int iVar1;
  int iVar2;
  ON_MeshTopologyEdge *pOVar3;
  ON_MeshTopologyVertex *pOVar4;
  ON_MeshTopologyVertex *pOVar5;
  ON_3dPoint local_d0;
  ON_3dPoint local_b8;
  undefined1 local_a0 [8];
  ON_3dPointListRef vertex_list;
  int vcount;
  int vi1;
  int vi0;
  ON_MeshTopologyVertex *v1;
  ON_MeshTopologyVertex *v0;
  int *topvi;
  int tope_index_local;
  ON_MeshTopology *this_local;
  ON_Line *L;
  
  from_pt.y = ON_3dPoint::UnsetPoint.y;
  from_pt.x = ON_3dPoint::UnsetPoint.x;
  from_pt.z = ON_3dPoint::UnsetPoint.z;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line(__return_storage_ptr__,from_pt,to_pt);
  if ((((this->m_mesh != (ON_Mesh *)0x0) && (-1 < tope_index)) &&
      (iVar1 = ON_SimpleArray<ON_MeshTopologyEdge>::Count(&this->m_tope), tope_index < iVar1)) &&
     (((pOVar3 = ON_SimpleArray<ON_MeshTopologyEdge>::operator[](&this->m_tope,tope_index),
       -1 < pOVar3->m_topvi[0] &&
       (iVar1 = pOVar3->m_topvi[0],
       iVar2 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&this->m_topv), iVar1 < iVar2)) &&
      ((-1 < pOVar3->m_topvi[1] &&
       (iVar1 = pOVar3->m_topvi[1],
       iVar2 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&this->m_topv), iVar1 < iVar2)))))) {
    pOVar4 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,pOVar3->m_topvi[0]);
    pOVar5 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&this->m_topv,pOVar3->m_topvi[1]);
    if (((0 < pOVar4->m_v_count) && (pOVar4->m_vi != (int *)0x0)) &&
       ((0 < pOVar5->m_v_count && (pOVar5->m_vi != (int *)0x0)))) {
      iVar1 = *pOVar4->m_vi;
      iVar2 = *pOVar5->m_vi;
      vertex_list.m_fP._4_4_ =
           ON_SimpleArray<ON_3fPoint>::Count(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
      if ((((-1 < iVar1) && (iVar1 < vertex_list.m_fP._4_4_)) && (-1 < iVar2)) &&
         (iVar2 < vertex_list.m_fP._4_4_)) {
        ON_3dPointListRef::ON_3dPointListRef((ON_3dPointListRef *)local_a0,this->m_mesh);
        ON_3dPointListRef::operator[](&local_b8,(ON_3dPointListRef *)local_a0,iVar1);
        (__return_storage_ptr__->from).z = local_b8.z;
        (__return_storage_ptr__->from).x = local_b8.x;
        (__return_storage_ptr__->from).y = local_b8.y;
        ON_3dPointListRef::operator[](&local_d0,(ON_3dPointListRef *)local_a0,iVar2);
        (__return_storage_ptr__->to).x = local_d0.x;
        (__return_storage_ptr__->to).y = local_d0.y;
        (__return_storage_ptr__->to).z = local_d0.z;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Line ON_MeshTopology::TopEdgeLine( int tope_index ) const
{
  ON_Line L(ON_3dPoint::UnsetPoint,ON_3dPoint::UnsetPoint);
  if ( m_mesh && tope_index >= 0 && tope_index < m_tope.Count() )
  {
    const int* topvi = m_tope[tope_index].m_topvi;
    if (   topvi[0] >= 0 && topvi[0] < m_topv.Count() 
        && topvi[1] >= 0 && topvi[1] < m_topv.Count() )
    {
      const ON_MeshTopologyVertex& v0 = m_topv[topvi[0]];
      const ON_MeshTopologyVertex& v1 = m_topv[topvi[1]];
      if ( v0.m_v_count > 0 && v0.m_vi && v1.m_v_count > 0 && v1.m_vi )
      {
        int vi0 = v0.m_vi[0];
        int vi1 = v1.m_vi[0];
        int vcount = m_mesh->m_V.Count();
        if ( vi0 >= 0 && vi0 < vcount && vi1 >= 0 && vi1 < vcount )
        {
          const ON_3dPointListRef vertex_list(m_mesh);
          L.from = vertex_list[vi0];
          L.to   = vertex_list[vi1];
        }
      }
    }
  }
  return L;
}